

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_interpolate_edge
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  REF_DBL log_m [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_DBL aRStack_b8 [6];
  REF_DBL local_88 [6];
  REF_DBL local_58 [7];
  
  if ((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
     (((node1 < 0 || (ref_node->global[(uint)node0] < 0)) || (ref_node->global[(uint)node1] < 0))))
  {
    pcVar7 = "node invalid";
    uVar3 = 3;
    uVar4 = 0xa3e;
    uVar6 = 3;
  }
  else {
    pRVar2 = ref_node->real;
    lVar5 = 0;
    do {
      pRVar2[new_node * 0xf + lVar5] =
           pRVar2[(ulong)(uint)(node0 * 0xf) + lVar5] * (1.0 - node1_weight) +
           pRVar2[(ulong)(uint)(node1 * 0xf) + lVar5] * node1_weight;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    iVar1 = ref_node->naux;
    if (0 < (long)iVar1) {
      pRVar2 = ref_node->aux;
      lVar5 = 0;
      do {
        pRVar2[iVar1 * new_node + lVar5] =
             pRVar2[(ulong)(uint)(iVar1 * node0) + lVar5] * (1.0 - node1_weight) +
             pRVar2[(ulong)(uint)(iVar1 * node1) + lVar5] * node1_weight;
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    pRVar2 = ref_node->real;
    lVar5 = 0;
    do {
      local_58[lVar5] = pRVar2[node0 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    lVar5 = 0;
    do {
      local_88[lVar5] = pRVar2[node1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    uVar3 = ref_matrix_weight_m(local_58,local_88,node1_weight,aRStack_b8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa4d,
             "ref_node_interpolate_edge",(ulong)uVar3,"log weight");
      return uVar3;
    }
    uVar3 = ref_node_metric_set_log(ref_node,new_node,aRStack_b8);
    if (uVar3 == 0) {
      return 0;
    }
    pcVar7 = "log new";
    uVar4 = 0xa4f;
    uVar6 = (ulong)uVar3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_interpolate_edge",uVar6,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_edge(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1,
                                             REF_DBL node1_weight,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m[6];
  REF_INT i;
  REF_DBL node0_weight = 1.0 - node1_weight;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        node0_weight * ref_node_xyz(ref_node, i, node0) +
        node1_weight * ref_node_xyz(ref_node, i, node1);

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        node0_weight * ref_node_aux(ref_node, i, node0) +
        node1_weight * ref_node_aux(ref_node, i, node1);

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");

  RSS(ref_matrix_weight_m(log_m0, log_m1, node1_weight, log_m), "log weight");

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}